

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_file_pos_after_op_with_offset(void)

{
  long *plVar1;
  int iVar2;
  __off64_t _Var3;
  undefined8 uVar4;
  void *extraout_RAX;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_buf_t uVar7;
  code *pcStack_28;
  code *pcStack_20;
  _func_void *local_18;
  
  pcStack_20 = (code *)0x15991f;
  unlink("test_file");
  pcStack_20 = (code *)0x159924;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_20 = (code *)0x15994b;
  iVar2 = uv_fs_open(loop,&open_req1,"test_file",0x42,0x180,0);
  if (iVar2 < 1) {
    pcStack_20 = (code *)0x159ae3;
    run_test_fs_file_pos_after_op_with_offset_cold_1();
LAB_00159ae3:
    pcStack_20 = (code *)0x159ae8;
    run_test_fs_file_pos_after_op_with_offset_cold_2();
LAB_00159ae8:
    pcStack_20 = (code *)0x159aed;
    run_test_fs_file_pos_after_op_with_offset_cold_3();
LAB_00159aed:
    pcStack_20 = (code *)0x159af2;
    run_test_fs_file_pos_after_op_with_offset_cold_4();
LAB_00159af2:
    pcStack_20 = (code *)0x159af7;
    run_test_fs_file_pos_after_op_with_offset_cold_5();
LAB_00159af7:
    pcStack_20 = (code *)0x159afc;
    run_test_fs_file_pos_after_op_with_offset_cold_6();
LAB_00159afc:
    pcStack_20 = (code *)0x159b01;
    run_test_fs_file_pos_after_op_with_offset_cold_7();
  }
  else {
    pcStack_20 = (code *)0x15995f;
    uv_fs_req_cleanup(&open_req1);
    pcStack_20 = (code *)0x159970;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_18 = (_func_void *)0x0;
    pcStack_20 = (code *)0x1599aa;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0);
    if (iVar2 != 0xd) goto LAB_00159ae3;
    pcStack_20 = (code *)0x1599c5;
    _Var3 = lseek64((int)open_req1.result,0,1);
    if (_Var3 != 0) goto LAB_00159ae8;
    pcStack_20 = (code *)0x1599da;
    uv_fs_req_cleanup(&write_req);
    pcStack_20 = (code *)0x1599eb;
    uVar7 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_18 = (_func_void *)0x0;
    pcStack_20 = (code *)0x159a25;
    iov = uVar7;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0);
    if (iVar2 != 0xd) goto LAB_00159aed;
    pcStack_20 = (code *)0x159a41;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00159af2;
    pcStack_20 = (code *)0x159a5b;
    _Var3 = lseek64((int)open_req1.result,0,1);
    if (_Var3 != 0) goto LAB_00159af7;
    pcStack_20 = (code *)0x159a70;
    uv_fs_req_cleanup();
    pcStack_20 = (code *)0x159a86;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00159afc;
    pcStack_20 = (code *)0x159a96;
    uv_fs_req_cleanup(&close_req);
    pcStack_20 = (code *)0x159aa2;
    unlink("test_file");
    pcStack_20 = (code *)0x159aa7;
    uVar4 = uv_default_loop();
    pcStack_20 = (code *)0x159abb;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_20 = (code *)0x159ac5;
    uv_run(uVar4,0);
    pcStack_20 = (code *)0x159aca;
    uv_default_loop();
    pcStack_20 = (code *)0x159ad2;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_20 = run_test_fs_null_req;
  run_test_fs_file_pos_after_op_with_offset_cold_8();
  pcStack_28 = (code *)0x159b1a;
  pcStack_20 = (code *)extraout_RAX;
  iVar2 = uv_fs_open(0,0,0,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_28 = (code *)0x159b30;
    iVar2 = uv_fs_close(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e35;
    pcStack_20 = (code *)0x0;
    pcStack_28 = (code *)0x159b58;
    iVar2 = uv_fs_read(0,0,0,0,0,0xffffffffffffffff);
    if (iVar2 != -0x16) goto LAB_00159e3a;
    pcStack_20 = (code *)0x0;
    pcStack_28 = (code *)0x159b80;
    iVar2 = uv_fs_write(0,0,0,0,0,0xffffffffffffffff);
    if (iVar2 != -0x16) goto LAB_00159e3f;
    pcStack_28 = (code *)0x159b96;
    iVar2 = uv_fs_unlink(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e44;
    pcStack_28 = (code *)0x159baf;
    iVar2 = uv_fs_mkdir(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e49;
    pcStack_28 = (code *)0x159bc5;
    iVar2 = uv_fs_mkdtemp(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e4e;
    pcStack_28 = (code *)0x159bdb;
    iVar2 = uv_fs_mkstemp(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e53;
    pcStack_28 = (code *)0x159bf1;
    iVar2 = uv_fs_rmdir(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e58;
    pcStack_28 = (code *)0x159c0a;
    iVar2 = uv_fs_scandir(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e5d;
    pcStack_28 = (code *)0x159c23;
    iVar2 = uv_fs_link(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e62;
    pcStack_28 = (code *)0x159c3f;
    iVar2 = uv_fs_symlink(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e67;
    pcStack_28 = (code *)0x159c55;
    iVar2 = uv_fs_readlink(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e6c;
    pcStack_28 = (code *)0x159c6b;
    iVar2 = uv_fs_realpath(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e71;
    pcStack_28 = (code *)0x159c87;
    iVar2 = uv_fs_chown(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e76;
    pcStack_28 = (code *)0x159ca3;
    iVar2 = uv_fs_fchown(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e7b;
    pcStack_28 = (code *)0x159cb9;
    iVar2 = uv_fs_stat(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e80;
    pcStack_28 = (code *)0x159ccf;
    iVar2 = uv_fs_lstat(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e85;
    pcStack_28 = (code *)0x159ce5;
    iVar2 = uv_fs_fstat(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e8a;
    pcStack_28 = (code *)0x159cfe;
    iVar2 = uv_fs_rename(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e8f;
    pcStack_28 = (code *)0x159d14;
    iVar2 = uv_fs_fsync(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e94;
    pcStack_28 = (code *)0x159d2a;
    iVar2 = uv_fs_fdatasync(0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e99;
    pcStack_28 = (code *)0x159d43;
    iVar2 = uv_fs_ftruncate(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159e9e;
    pcStack_28 = (code *)0x159d5f;
    iVar2 = uv_fs_copyfile(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159ea3;
    pcStack_20 = (code *)0x0;
    pcStack_28 = (code *)0x159d83;
    iVar2 = uv_fs_sendfile(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159ea8;
    pcStack_28 = (code *)0x159d9c;
    iVar2 = uv_fs_access(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159ead;
    pcStack_28 = (code *)0x159db5;
    iVar2 = uv_fs_chmod(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159eb2;
    pcStack_28 = (code *)0x159dce;
    iVar2 = uv_fs_fchmod(0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159eb7;
    pcStack_28 = (code *)0x159dea;
    iVar2 = uv_fs_utime(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159ebc;
    pcStack_28 = (code *)0x159e06;
    iVar2 = uv_fs_futime(0,0,0,0,0,0);
    if (iVar2 != -0x16) goto LAB_00159ec1;
    pcStack_28 = (code *)0x159e1c;
    iVar2 = uv_fs_statfs(0,0,0,0);
    if (iVar2 == -0x16) {
      pcStack_28 = (code *)0x159e2c;
      uv_fs_req_cleanup(0);
      return 0;
    }
  }
  else {
    pcStack_28 = (code *)0x159e35;
    run_test_fs_null_req_cold_1();
LAB_00159e35:
    pcStack_28 = (code *)0x159e3a;
    run_test_fs_null_req_cold_2();
LAB_00159e3a:
    pcStack_28 = (code *)0x159e3f;
    run_test_fs_null_req_cold_3();
LAB_00159e3f:
    pcStack_28 = (code *)0x159e44;
    run_test_fs_null_req_cold_4();
LAB_00159e44:
    pcStack_28 = (code *)0x159e49;
    run_test_fs_null_req_cold_5();
LAB_00159e49:
    pcStack_28 = (code *)0x159e4e;
    run_test_fs_null_req_cold_6();
LAB_00159e4e:
    pcStack_28 = (code *)0x159e53;
    run_test_fs_null_req_cold_7();
LAB_00159e53:
    pcStack_28 = (code *)0x159e58;
    run_test_fs_null_req_cold_8();
LAB_00159e58:
    pcStack_28 = (code *)0x159e5d;
    run_test_fs_null_req_cold_9();
LAB_00159e5d:
    pcStack_28 = (code *)0x159e62;
    run_test_fs_null_req_cold_10();
LAB_00159e62:
    pcStack_28 = (code *)0x159e67;
    run_test_fs_null_req_cold_11();
LAB_00159e67:
    pcStack_28 = (code *)0x159e6c;
    run_test_fs_null_req_cold_12();
LAB_00159e6c:
    pcStack_28 = (code *)0x159e71;
    run_test_fs_null_req_cold_13();
LAB_00159e71:
    pcStack_28 = (code *)0x159e76;
    run_test_fs_null_req_cold_14();
LAB_00159e76:
    pcStack_28 = (code *)0x159e7b;
    run_test_fs_null_req_cold_15();
LAB_00159e7b:
    pcStack_28 = (code *)0x159e80;
    run_test_fs_null_req_cold_16();
LAB_00159e80:
    pcStack_28 = (code *)0x159e85;
    run_test_fs_null_req_cold_17();
LAB_00159e85:
    pcStack_28 = (code *)0x159e8a;
    run_test_fs_null_req_cold_18();
LAB_00159e8a:
    pcStack_28 = (code *)0x159e8f;
    run_test_fs_null_req_cold_19();
LAB_00159e8f:
    pcStack_28 = (code *)0x159e94;
    run_test_fs_null_req_cold_20();
LAB_00159e94:
    pcStack_28 = (code *)0x159e99;
    run_test_fs_null_req_cold_21();
LAB_00159e99:
    pcStack_28 = (code *)0x159e9e;
    run_test_fs_null_req_cold_22();
LAB_00159e9e:
    pcStack_28 = (code *)0x159ea3;
    run_test_fs_null_req_cold_23();
LAB_00159ea3:
    pcStack_28 = (code *)0x159ea8;
    run_test_fs_null_req_cold_24();
LAB_00159ea8:
    pcStack_28 = (code *)0x159ead;
    run_test_fs_null_req_cold_25();
LAB_00159ead:
    pcStack_28 = (code *)0x159eb2;
    run_test_fs_null_req_cold_26();
LAB_00159eb2:
    pcStack_28 = (code *)0x159eb7;
    run_test_fs_null_req_cold_27();
LAB_00159eb7:
    pcStack_28 = (code *)0x159ebc;
    run_test_fs_null_req_cold_28();
LAB_00159ebc:
    pcStack_28 = (code *)0x159ec1;
    run_test_fs_null_req_cold_29();
LAB_00159ec1:
    pcStack_28 = (code *)0x159ec6;
    run_test_fs_null_req_cold_30();
  }
  pcStack_28 = run_test_fs_statfs;
  run_test_fs_null_req_cold_31();
  puVar6 = (uv_loop_t *)&stack0xfffffffffffffe28;
  loop = (uv_loop_t *)uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_statfs(0,&stack0xfffffffffffffe28,".",0);
  if (iVar2 == 0) {
    statfs_cb((uv_fs_t *)&stack0xfffffffffffffe28);
    puVar5 = puVar6;
    if (statfs_cb_count != 1) goto LAB_00159f4d;
    puVar5 = loop;
    iVar2 = uv_fs_statfs(loop,&stack0xfffffffffffffe28,".",statfs_cb);
    if (iVar2 != 0) goto LAB_00159f52;
    puVar5 = loop;
    uv_run(loop,0);
    if (statfs_cb_count == 2) {
      return 0;
    }
  }
  else {
    run_test_fs_statfs_cold_1();
LAB_00159f4d:
    run_test_fs_statfs_cold_2();
LAB_00159f52:
    run_test_fs_statfs_cold_3();
  }
  run_test_fs_statfs_cold_4();
  if (puVar5->backend_fd == 0x22) {
    puVar6 = puVar5;
    if (puVar5->watcher_queue[0] != (void *)0x0) goto LAB_00159fc1;
    plVar1 = (long *)puVar5->watcher_queue[1];
    if (plVar1 == (long *)0x0) goto LAB_00159fc6;
    if (*plVar1 == 0) goto LAB_00159fcb;
    if (plVar1[1] == 0) goto LAB_00159fd0;
    if (plVar1[2] == 0) goto LAB_00159fd5;
    if ((ulong)plVar1[2] < (ulong)plVar1[3]) goto LAB_00159fda;
    if ((ulong)plVar1[3] < (ulong)plVar1[4]) goto LAB_00159fdf;
    if ((ulong)plVar1[6] <= (ulong)plVar1[5]) {
      iVar2 = uv_fs_req_cleanup(puVar5);
      if (puVar5->watcher_queue[1] == (void *)0x0) {
        statfs_cb_count = statfs_cb_count + 1;
        return iVar2;
      }
      goto LAB_00159fe9;
    }
  }
  else {
    statfs_cb_cold_1();
    puVar6 = puVar5;
LAB_00159fc1:
    statfs_cb_cold_2();
LAB_00159fc6:
    statfs_cb_cold_10();
LAB_00159fcb:
    statfs_cb_cold_9();
LAB_00159fd0:
    statfs_cb_cold_8();
LAB_00159fd5:
    statfs_cb_cold_7();
LAB_00159fda:
    statfs_cb_cold_6();
LAB_00159fdf:
    statfs_cb_cold_5();
  }
  statfs_cb_cold_4();
LAB_00159fe9:
  statfs_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar6,0);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_file_pos_after_op_with_offset) {
  int r;

  /* Setup. */
  unlink("test_file");
  loop = uv_default_loop();

  r = uv_fs_open(loop,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r > 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, 0, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}